

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::Pair>::matchValue<mathiu::impl::Pair_const&>
          (Id<mathiu::impl::Pair> *this,Pair *v)

{
  bool bVar1;
  Pair *lhs;
  IdBlockBase<mathiu::impl::Pair> *this_00;
  ValueVariant<mathiu::impl::Pair> *pVVar2;
  Pair *v_local;
  Id<mathiu::impl::Pair> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::Pair>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::Pair>;
    pVVar2 = IdBlockBase<mathiu::impl::Pair>::variant(this_00);
    IdUtil<mathiu::impl::Pair>::bindValue<mathiu::impl::Pair_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }